

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeNative_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,bool invector,
          FieldDef *field,bool forcopy)

{
  StructDef *pSVar1;
  EnumDef *def;
  Value *pVVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string nn;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    NativeString_abi_cxx11_(__return_storage_ptr__,this,field);
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    nn._M_dataplus._M_p._0_4_ = type->element;
    nn.field_2._8_2_ = type->fixed_length;
    nn._M_dataplus._M_p._4_4_ = 0;
    nn._M_string_length = (size_type)type->struct_def;
    nn.field_2._M_allocated_capacity = (size_type)type->enum_def;
    GenTypeNative_abi_cxx11_(&type_name,this,(Type *)&nn,true,field,false);
    pSVar1 = type->struct_def;
    if (pSVar1 == (StructDef *)0x0) {
LAB_00165186:
      std::operator+(&nn,"std::vector<",&type_name);
      std::operator+(__return_storage_ptr__,&nn,">");
      this_00 = &nn;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nn,"native_custom_alloc",(allocator<char> *)&local_b0);
      pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(pSVar1->super_Definition).attributes,&nn);
      std::__cxx11::string::~string((string *)&nn);
      if (pVVar2 == (Value *)0x0) goto LAB_00165186;
      pSVar1 = type->struct_def;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nn,"native_custom_alloc",(allocator<char> *)&local_b0);
      pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(pSVar1->super_Definition).attributes,&nn);
      std::__cxx11::string::~string((string *)&nn);
      std::operator+(&local_90,"std::vector<",&type_name);
      std::operator+(&local_70,&local_90,",");
      std::operator+(&local_50,&local_70,&pVVar2->constant);
      std::operator+(&local_b0,&local_50,"<");
      std::operator+(&nn,&local_b0,&type_name);
      std::operator+(__return_storage_ptr__,&nn,">>");
      std::__cxx11::string::~string((string *)&nn);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_90;
    }
    std::__cxx11::string::~string((string *)this_00);
    goto LAB_00165341;
  case BASE_TYPE_STRUCT:
    pSVar1 = type->struct_def;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nn,"",(allocator<char> *)&local_b0);
    BaseGenerator::WrapInNameSpace
              (&type_name,&this->super_BaseGenerator,&pSVar1->super_Definition,&nn);
    std::__cxx11::string::~string((string *)&nn);
    pSVar1 = type->struct_def;
    if ((type->base_type == BASE_TYPE_STRUCT) && (pSVar1->fixed == true)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nn,"native_type",(allocator<char> *)&local_b0);
      pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(pSVar1->super_Definition).attributes,&nn);
      std::__cxx11::string::~string((string *)&nn);
      if (pVVar2 != (Value *)0x0) {
        std::__cxx11::string::_M_assign((string *)&type_name);
      }
      if (((invector) || ((field->native_inline & 1U) != 0)) || (forcopy)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type_name._M_dataplus._M_p == &type_name.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,
                        type_name.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = type_name.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = type_name._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(type_name.field_2._M_allocated_capacity._1_7_,
                        type_name.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = type_name._M_string_length;
        type_name._M_string_length = 0;
        type_name.field_2._M_local_buf[0] = '\0';
        type_name._M_dataplus._M_p = (pointer)&type_name.field_2;
      }
      else {
        GenTypeNativePtr(__return_storage_ptr__,this,&type_name,field,false);
      }
    }
    else {
      WrapNativeNameInNameSpace_abi_cxx11_(&nn,this,pSVar1,&(this->opts_).super_IDLOptions);
      if ((forcopy) || (field->native_inline == true)) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&nn);
      }
      else {
        GenTypeNativePtr(__return_storage_ptr__,this,&nn,field,false);
      }
      std::__cxx11::string::~string((string *)&nn);
    }
    std::__cxx11::string::~string((string *)&type_name);
    break;
  case BASE_TYPE_UNION:
    def = type->enum_def;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nn,"",(allocator<char> *)&local_b0);
    BaseGenerator::WrapInNameSpace(&type_name,&this->super_BaseGenerator,&def->super_Definition,&nn)
    ;
    std::__cxx11::string::~string((string *)&nn);
    std::operator+(__return_storage_ptr__,&type_name,"Union");
LAB_00165341:
    std::__cxx11::string::~string((string *)&type_name);
    break;
  default:
    if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
      GenOptionalDecl_abi_cxx11_(__return_storage_ptr__,this,type);
    }
    else {
      GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type,true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeNative(const Type &type, bool invector,
                            const FieldDef &field, bool forcopy = false) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: {
        return NativeString(&field);
      }
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        const auto type_name = GenTypeNative(type.VectorType(), true, field);
        if (type.struct_def &&
            type.struct_def->attributes.Lookup("native_custom_alloc")) {
          auto native_custom_alloc =
              type.struct_def->attributes.Lookup("native_custom_alloc");
          return "std::vector<" + type_name + "," +
                 native_custom_alloc->constant + "<" + type_name + ">>";
        } else {
          return "std::vector<" + type_name + ">";
        }
      }
      case BASE_TYPE_STRUCT: {
        auto type_name = WrapInNameSpace(*type.struct_def);
        if (IsStruct(type)) {
          auto native_type = type.struct_def->attributes.Lookup("native_type");
          if (native_type) { type_name = native_type->constant; }
          if (invector || field.native_inline || forcopy) {
            return type_name;
          } else {
            return GenTypeNativePtr(type_name, &field, false);
          }
        } else {
          const auto nn = WrapNativeNameInNameSpace(*type.struct_def, opts_);
          return (forcopy || field.native_inline)
                     ? nn
                     : GenTypeNativePtr(nn, &field, false);
        }
      }
      case BASE_TYPE_UNION: {
        auto type_name = WrapInNameSpace(*type.enum_def);
        return type_name + "Union";
      }
      default: {
        return field.IsScalarOptional() ? GenOptionalDecl(type)
                                        : GenTypeBasic(type, true);
      }
    }
  }